

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ntru_decode(NTRUEncodeSchedule *sched,uint16_t *rs_out,ptrlen data)

{
  uint16_t uVar1;
  long lVar2;
  uint8_t *local_88;
  size_t i_1;
  uint32_t r2;
  uint32_t r1;
  uint64_t mrecip;
  uint32_t m;
  uint32_t r_1;
  uint32_t r;
  uint8_t byte;
  uint16_t op;
  size_t i;
  size_t tail;
  size_t head;
  uint32_t *rs;
  uint8_t *pos;
  uint8_t *base;
  size_t n;
  uint16_t *rs_out_local;
  NTRUEncodeSchedule *sched_local;
  ptrlen data_local;
  
  data_local.ptr = (void *)data.len;
  pos = (uint8_t *)data.ptr;
  base = (uint8_t *)sched->nvals;
  rs = (uint32_t *)((long)&((NTRUEncodeSchedule *)pos)->nvals + (long)data_local.ptr);
  n = (size_t)rs_out;
  rs_out_local = (uint16_t *)sched;
  sched_local = (NTRUEncodeSchedule *)pos;
  head = (size_t)safemalloc((size_t)base,4,0);
  i = *(size_t *)(rs_out_local + 4);
  *(undefined4 *)(head + i * 4) = 0;
  _r = *(long *)(rs_out_local + 8);
  tail = i;
  while (lVar2 = _r + -1, _r != 0) {
    r_1._2_2_ = *(ushort *)(*(long *)(rs_out_local + 0x10) + lVar2 * 4);
    if (r_1._2_2_ == 0) {
      m = *(uint32_t *)(head + i * 4);
      i = (ulong)(base + (i - 1)) % (ulong)base;
      tail = (ulong)(base + (tail - 1)) % (ulong)base;
      *(uint32_t *)(head + tail * 4) = m;
      _r = lVar2;
    }
    else if (r_1._2_2_ == 1) {
      if (rs <= pos) {
        _r = lVar2;
        __assert_fail("pos > base",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c"
                      ,0x33b,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
      }
      r_1._1_1_ = *(byte *)((long)rs + -1);
      *(uint *)(head + i * 4) = *(int *)(head + i * 4) << 8 | (uint)r_1._1_1_;
      _r = lVar2;
      rs = (uint32_t *)((long)rs + -1);
    }
    else {
      mrecip._4_4_ = *(uint32_t *)(head + i * 4);
      i = (ulong)(base + (i - 1)) % (ulong)base;
      mrecip._0_4_ = r_1._2_2_ - 2;
      _r = lVar2;
      _r2 = reciprocal_for_reduction((uint16_t)(int)mrecip);
      uVar1 = reduce_with_quot(mrecip._4_4_,(uint32_t *)&i_1,(uint16_t)(int)mrecip,_r2);
      i_1._4_4_ = (uint)uVar1;
      *(undefined4 *)(head + ((ulong)(base + (tail - 1)) % (ulong)base) * 4) = (undefined4)i_1;
      tail = (ulong)(base + ((ulong)(base + (tail - 1)) % (ulong)base - 1)) % (ulong)base;
      *(uint *)(head + tail * 4) = i_1._4_4_;
    }
  }
  if (rs != (uint32_t *)pos) {
    _r = lVar2;
    __assert_fail("pos == base",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x35a,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
  }
  if (tail != 0) {
    _r = lVar2;
    __assert_fail("head == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x35b,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
  }
  if ((uint8_t *)i != base + -1) {
    _r = lVar2;
    __assert_fail("tail == n-1",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x35c,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
  }
  for (local_88 = (uint8_t *)0x0; local_88 < base; local_88 = local_88 + 1) {
    *(short *)(n + (long)local_88 * 2) = (short)*(undefined4 *)(head + (long)local_88 * 4);
  }
  _r = lVar2;
  smemclr((void *)head,(long)base << 2);
  safefree((void *)head);
  return;
}

Assistant:

void ntru_decode(NTRUEncodeSchedule *sched, uint16_t *rs_out, ptrlen data)
{
    size_t n = sched->nvals;
    const uint8_t *base = (const uint8_t *)data.ptr;
    const uint8_t *pos = base + data.len;

    /*
     * Initialise the queue to a single zero, at the 'endpos' position
     * that will mean the final output is correctly aligned.
     *
     * 'head' and 'tail' have the same meanings as in encoding. So
     * 'tail' is the location that BYTE modifies and COPY and COMBINE
     * consume from, and 'head' is the location that COPY and COMBINE
     * push on to. As in encoding, they both point at the extremal
     * full slots in the array.
     */
    uint32_t *rs = snewn(n, uint32_t);
    size_t head = sched->endpos, tail = head;
    rs[tail] = 0;

    for (size_t i = sched->nops; i-- > 0 ;) {
        uint16_t op = sched->ops[i];
        switch (op) {
          case ENC_BYTE: {
            assert(pos > base);
            uint8_t byte = *--pos;
            rs[tail] = (rs[tail] << 8) | byte;
            break;
          }
          case ENC_COPY: {
            uint32_t r = rs[tail];
            tail = (tail + n - 1) % n;
            head = (head + n - 1) % n;
            rs[head] = r;
            break;
          }
          default: {
            uint32_t r = rs[tail];
            tail = (tail + n - 1) % n;

            uint32_t m = op - ENC_COMBINE_BASE;
            uint64_t mrecip = reciprocal_for_reduction(m);

            uint32_t r1, r2;
            r1 = reduce_with_quot(r, &r2, m, mrecip);

            head = (head + n - 1) % n;
            rs[head] = r2;
            head = (head + n - 1) % n;
            rs[head] = r1;
            break;
          }
        }
    }

    assert(pos == base);
    assert(head == 0);
    assert(tail == n-1);

    for (size_t i = 0; i < n; i++)
        rs_out[i] = rs[i];
    smemclr(rs, n * sizeof(*rs));
    sfree(rs);
}